

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-vec1.c
# Opt level: O0

void mul_mat_vec_f16_0(uint16_t *src0,uint16_t *src1,float *dst,int nrows,int ncols)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  __m256 v;
  long lVar3;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  float fVar4;
  undefined1 auVar5 [64];
  int j_1;
  __m256 b;
  __m256 a;
  int j;
  uint16_t *src0_row;
  __m256 sum;
  int i;
  int ncols8;
  undefined4 local_1a4;
  undefined1 in_stack_fffffffffffffe60 [32];
  undefined4 local_14c;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined4 local_108;
  undefined1 extraout_var [60];
  
  for (local_108 = 0; local_108 < in_ECX; local_108 = local_108 + 1) {
    uVar6 = 0;
    uVar7 = 0;
    lVar3 = in_RDI + (long)(int)(local_108 * in_R8D) * 2;
    for (local_14c = 0; local_14c < (int)(in_R8D & 0xfffffff8); local_14c = local_14c + 8) {
      auVar1 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar3 + (long)local_14c * 2));
      in_stack_fffffffffffffe60 =
           vcvtph2ps_f16c(*(undefined1 (*) [16])(in_RSI + (long)local_14c * 2));
      auVar2 = vfmadd213ps_fma(in_stack_fffffffffffffe60,auVar1,ZEXT1632(CONCAT88(uVar7,uVar6)));
      uVar6 = auVar2._0_8_;
      uVar7 = auVar2._8_8_;
    }
    v[2] = (float)(int)uVar6;
    v[3] = (float)(int)((ulong)uVar6 >> 0x20);
    v._0_8_ = lVar3;
    v[4] = (float)(int)uVar7;
    v[5] = (float)(int)((ulong)uVar7 >> 0x20);
    v[6] = 0.0;
    v[7] = 0.0;
    fVar4 = reduce_vector8_0(v);
    *(float *)(in_RDX + (long)local_108 * 4) = fVar4;
    for (local_1a4 = in_R8D & 0xfffffff8; (int)local_1a4 < (int)in_R8D; local_1a4 = local_1a4 + 1) {
      fVar4 = fp16_ieee_to_fp32_value(in_stack_fffffffffffffe60._14_2_);
      auVar5._0_4_ = fp16_ieee_to_fp32_value(in_stack_fffffffffffffe60._14_2_);
      auVar5._4_60_ = extraout_var;
      auVar2 = vfmadd213ss_fma(auVar5._0_16_,ZEXT416((uint)fVar4),
                               ZEXT416(*(uint *)(in_RDX + (long)local_108 * 4)));
      *(int *)(in_RDX + (long)local_108 * 4) = auVar2._0_4_;
    }
  }
  return;
}

Assistant:

void mul_mat_vec_f16_0(
    const uint16_t * src0,
    const uint16_t * src1,
             float * dst,
    int nrows,
    int ncols) {

    const int ncols8 = ncols & ~7;

    for (int i = 0; i < nrows; i++) {
        __m256 sum = _mm256_setzero_ps();

        const uint16_t * src0_row = src0 + i * ncols;
        for (int j = 0; j < ncols8; j += 8) {
            __m256 a = _mm256_cvtph_ps(_mm_loadu_si128((__m128i*)(src0_row + j)));
            __m256 b = _mm256_cvtph_ps(_mm_loadu_si128((__m128i*)(src1 + j)));
#if defined(__FMA__)
            sum = _mm256_fmadd_ps(a, b, sum);
#else
            sum = _mm256_add_ps(_mm256_mul_ps(a, b), sum);
#endif
        }
        dst[i] = reduce_vector8_0(sum);

        for (int j = ncols8; j < ncols; j++) {
            dst[i] += fp16_ieee_to_fp32_value(src0_row[j]) * fp16_ieee_to_fp32_value(src1[j]);
        }
    }
}